

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# example_custom_check.cpp
# Opt level: O3

void __thiscall money_t::~money_t(money_t *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  this->_vptr_money_t = (_func_int **)&PTR__money_t_00109d90;
  pcVar1 = (this->currency_)._M_dataplus._M_p;
  paVar2 = &(this->currency_).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

virtual ~money_t() {}